

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# DWARFDebugLine.cpp
# Opt level: O3

bool __thiscall
llvm::DWARFDebugLine::LineTable::getFileLineInfoForAddress
          (LineTable *this,SectionedAddress Address,char *CompDir,FileLineInfoKind Kind,
          DILineInfo *Result)

{
  pointer pRVar1;
  FileLineInfoKind Kind_00;
  bool bVar2;
  uint32_t uVar3;
  size_t sVar4;
  ulong FileIndex;
  StringRef CompDir_00;
  anon_union_16_2_fc7899a5_for_OptionalStorage<llvm::StringRef,_true>_2 local_58;
  undefined8 local_48;
  ulong local_40;
  FileLineInfoKind local_34;
  
  uVar3 = lookupAddress(this,Address);
  if (uVar3 != 0xffffffff) {
    pRVar1 = (this->Rows).
             super__Vector_base<llvm::DWARFDebugLine::Row,_std::allocator<llvm::DWARFDebugLine::Row>_>
             ._M_impl.super__Vector_impl_data._M_start;
    FileIndex = (ulong)pRVar1[uVar3].File;
    local_34 = Kind;
    if (CompDir == (char *)0x0) {
      sVar4 = 0;
    }
    else {
      local_40 = FileIndex;
      sVar4 = strlen(CompDir);
      FileIndex = local_40;
    }
    Kind_00 = local_34;
    CompDir_00.Length = sVar4;
    CompDir_00.Data = CompDir;
    bVar2 = Prologue::getFileNameByIndex
                      (&this->Prologue,FileIndex,CompDir_00,local_34,&Result->FileName,native);
    if (bVar2) {
      Result->Line = pRVar1[uVar3].Line;
      Result->Column = (uint)pRVar1[uVar3].Column;
      Result->Discriminator = pRVar1[uVar3].Discriminator;
      getSourceByIndex((Optional<llvm::StringRef> *)&local_58.value,this,(ulong)pRVar1[uVar3].File,
                       Kind_00);
      *(undefined8 *)&(Result->Source).Storage.hasVal = local_48;
      (Result->Source).Storage.field_0.value.Data = local_58.value.Data;
      (Result->Source).Storage.field_0.value.Length = local_58.value.Length;
      return true;
    }
  }
  return false;
}

Assistant:

bool DWARFDebugLine::LineTable::getFileLineInfoForAddress(
    object::SectionedAddress Address, const char *CompDir,
    FileLineInfoKind Kind, DILineInfo &Result) const {
  // Get the index of row we're looking for in the line table.
  uint32_t RowIndex = lookupAddress(Address);
  if (RowIndex == -1U)
    return false;
  // Take file number and line/column from the row.
  const auto &Row = Rows[RowIndex];
  if (!getFileNameByIndex(Row.File, CompDir, Kind, Result.FileName))
    return false;
  Result.Line = Row.Line;
  Result.Column = Row.Column;
  Result.Discriminator = Row.Discriminator;
  Result.Source = getSourceByIndex(Row.File, Kind);
  return true;
}